

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O1

void __thiscall
Clasp::DefaultUnfoundedCheck::addIfReason(DefaultUnfoundedCheck *this,BodyPtr *n,uint32 uScc)

{
  Literal p;
  uint uVar1;
  uint uVar2;
  BodyNode *n_00;
  pointer pBVar3;
  bool bVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  weight_t S;
  AddReasonLit addFalseLits;
  weight_t local_4c;
  AddReasonLit local_48;
  
  n_00 = n->node;
  p.rep_ = (n_00->super_Node).lit.rep_;
  uVar1 = *(uint *)((long)(this->solver_->assign_).assign_.ebo_.buf + (ulong)(p.rep_ & 0xfffffffc));
  bVar6 = (byte)uVar1 & 3;
  bVar7 = ((p.rep_ & 2) == 0) + 1;
  uVar2 = *(uint *)&(n_00->super_Node).field_0x4;
  uVar5 = uVar2 & 0xfffffff;
  if (((byte)(uVar2 >> 0x1c) & uVar5 == uScc) == 0) {
    if ((bVar6 == bVar7) && (((p.rep_ & 2) * 2 + 4 & uVar1) == 0)) {
      if (uVar5 == uScc) {
        local_4c = 0;
        bVar4 = isExternal(this,n,&local_4c);
        if (!bVar4) {
          return;
        }
      }
      addReasonLit(this,p);
      return;
    }
  }
  else {
    pBVar3 = (this->bodies_).ebo_.buf;
    if (-1 < *(int *)(pBVar3 + n->id)) {
      local_4c = (this->extended_).ebo_.buf[pBVar3[n->id].lower_or_ext]->slack;
      bVar4 = isExternal(this,n,&local_4c);
      if (bVar4) {
        local_48.slack = local_4c;
        local_48.self = this;
        local_48.node = n_00;
        if (bVar6 == bVar7) {
          addReasonLit(this,(Literal)(n_00->super_Node).lit.rep_);
        }
        else {
          Asp::PrgDepGraph::visitBodyLiterals<Clasp::DefaultUnfoundedCheck::AddReasonLit>
                    (this->graph_,n_00,&local_48);
        }
      }
      pBVar3 = (this->bodies_).ebo_.buf + n->id;
      *(uint *)pBVar3 = *(uint *)pBVar3 | 0x80000000;
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->pickedExt_,&n->id);
    }
  }
  return;
}

Assistant:

void DefaultUnfoundedCheck::addIfReason(const BodyPtr& n, uint32 uScc) {
	bool inF = solver_->isFalse(n.node->lit);
	weight_t S;
	if (!n.node->extended() || n.node->scc != uScc) {
		if (inF && !solver_->seen(n.node->lit) && (n.node->scc != uScc || isExternal(n, (S=0)))) {
			addReasonLit(n.node->lit);
		}
	}
	else if (bodies_[n.id].picked == 0) {
		if (isExternal(n, S = extended_[bodies_[n.id].lower_or_ext]->slack)) {
			AddReasonLit addFalseLits = { this, n.node, S };
			if (inF) { addReasonLit(n.node->lit); }
			else     { graph_->visitBodyLiterals(*n.node, addFalseLits); }
		}
		bodies_[n.id].picked = 1;
		pickedExt_.push_back(n.id);
	}
}